

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O2

void __thiscall
QLocalSocketPrivate::_q_errorOccurred(QLocalSocketPrivate *this,SocketError socketError)

{
  QLocalSocket *this_00;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  QLocalSocketPrivate *this_01;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLocalSocket **)&this->field_0x8;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QLocalSocketPrivate *)0xc;
  latin1.m_data = "QLocalSocket";
  latin1.m_size = 0xc;
  QString::QString((QString *)&local_48,latin1);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  generateErrorString((QString *)&local_68,this_01,socketError,(QString *)&local_48);
  QIODevice::setErrorString((QString *)this_00);
  QLocalSocket::errorOccurred(this_00,socketError);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocketPrivate::_q_errorOccurred(QAbstractSocket::SocketError socketError)
{
    Q_Q(QLocalSocket);
    QString function = "QLocalSocket"_L1;
    QLocalSocket::LocalSocketError error = (QLocalSocket::LocalSocketError)socketError;
    QString errorString = generateErrorString(error, function);
    q->setErrorString(errorString);
    emit q->errorOccurred(error);
}